

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * unpack14_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in & 0x3fff;
  *out = base + *out;
  puVar1 = out + 1;
  *puVar1 = *in >> 0xe & 0x3fff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 2;
  *puVar1 = *in >> 0x1c;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 0x3ff) << 4 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 3;
  *puVar1 = *puVar2 >> 10 & 0x3fff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 4;
  *puVar1 = *puVar2 >> 0x18;
  puVar2 = in + 2;
  *puVar1 = (*puVar2 & 0x3f) << 8 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 5;
  *puVar1 = *puVar2 >> 6 & 0x3fff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 6;
  *puVar1 = *puVar2 >> 0x14;
  *puVar1 = (in[3] & 3) << 0xc | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[3] >> 2 & 0x3fff;
  *puVar1 = base + *puVar1;
  return in + 4;
}

Assistant:

uint32_t * unpack14_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 14 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  14  )   % (1U << 14 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 10 ))<<( 14 - 10 );
    *out += base;
    out++;
    *out = ( (*in) >>  10  )   % (1U << 14 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 6 ))<<( 14 - 6 );
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   % (1U << 14 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 2 ))<<( 14 - 2 );
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   % (1U << 14 )  ;
    *out += base;
    out++;

    return in + 1;
}